

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O3

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
::resize_buffer(flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
                *this,size_type size)

{
  buffer_t<char> *this_00;
  memory_resource *pmVar1;
  bool bVar2;
  ushort *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ushort *puVar7;
  long lVar8;
  pointer_type pcVar9;
  char *new_buffer;
  size_t new_buffer_size;
  sizes_t prev_sizes;
  char *local_b8;
  size_t local_b0;
  buffer_t<char> local_a8;
  flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
  *local_88;
  undefined1 *local_80;
  size_t *local_78;
  undefined1 local_70;
  flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
  local_68;
  sizes_t local_48;
  
  this_00 = &(this->buffer_).v2_;
  buffer_t<char>::validate(this_00);
  get_all_sizes(&local_48,this);
  local_b8 = (char *)0x0;
  local_78 = &local_b0;
  local_b0 = 0;
  local_70 = 1;
  local_88 = this;
  if (local_48.total_capacity < size) {
    pmVar1 = (this->buffer_).v1_._M_resource;
    local_80 = (undefined1 *)&local_b8;
    local_b8 = (char *)(**(code **)(*(long *)pmVar1 + 0x10))(pmVar1,size,1);
    local_b0 = size;
    if ((this->buffer_).v2_.last != (pointer_type)0x0) {
      memcpy(local_b8,(this->buffer_).v2_.begin,local_48.last_element.super_range.data_end);
      (this->buffer_).v2_.last = local_b8 + local_48.last_element.super_range.buffer_begin;
    }
  }
  else {
    if (size == 0) {
      local_80 = (undefined1 *)&local_b8;
      clear(this);
      goto LAB_0010dd62;
    }
    local_80 = (undefined1 *)&local_b8;
    if (local_48.total_capacity <= size) goto LAB_0010dd62;
    pmVar1 = (this->buffer_).v1_._M_resource;
    local_80 = (undefined1 *)&local_b8;
    local_b8 = (char *)(**(code **)(*(long *)pmVar1 + 0x10))(pmVar1,size,1);
    if (size < local_48.last_element.super_range.data_end) {
      puVar7 = (ushort *)this_00->begin;
      local_b0 = size;
      if ((puVar7 == (ushort *)0x0) || ((long)size < 0)) {
LAB_0010dcf2:
        std::terminate();
      }
      local_a8.end = (pointer_type)((long)puVar7 + size);
      if (size == 1) {
        bVar2 = true;
        local_a8.last = (pointer_type)0x0;
      }
      else {
        uVar4 = (ulong)*puVar7;
        uVar6 = size;
        puVar3 = puVar7;
        if (size < uVar4 + 2) {
          local_a8.last = (pointer_type)0x0;
          bVar2 = false;
        }
        else {
          do {
            local_a8.last = (pointer_type)puVar3;
            uVar5 = (ulong)((int)uVar4 + 3U & 0x1fffe);
            uVar6 = uVar6 - uVar5;
            bVar2 = (long)uVar6 < 2;
            if ((long)uVar6 < 2) break;
            uVar4 = (ulong)*(ushort *)((long)local_a8.last + uVar5);
            puVar3 = (ushort *)((long)local_a8.last + uVar5);
          } while (uVar4 + 2 <= uVar6);
        }
      }
      local_a8.begin = (pointer_type)puVar7;
      buffer_t<char>::validate(&local_a8);
      local_68.buffer_.begin._7_1_ = SUB81(local_a8.begin,0);
      local_68.buffer_.last._0_7_ = (undefined7)((ulong)local_a8.begin >> 8);
      local_68.buffer_._15_8_ = local_a8.last;
      if (bVar2) {
        flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
        ::last(&local_68);
        if ((pointer_type)CONCAT17(local_68.buffer_.begin._7_1_,local_68.buffer_.begin._0_7_) !=
            (this->buffer_).v2_.last) goto LAB_0010dcf2;
      }
      else {
        flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
        ::last(&local_68);
        if ((pointer_type)CONCAT17(local_68.buffer_.begin._7_1_,local_68.buffer_.begin._0_7_) ==
            (this->buffer_).v2_.last) goto LAB_0010dcf2;
      }
      flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
      ::last(&local_68);
      puVar7 = (ushort *)CONCAT17(local_68.buffer_.begin._7_1_,local_68.buffer_.begin._0_7_);
    }
    else {
      puVar7 = (ushort *)(this->buffer_).v2_.last;
      local_b0 = size;
    }
    if (puVar7 == (ushort *)0x0) {
      pcVar9 = (pointer_type)0x0;
    }
    else {
      lVar8 = (long)puVar7 - (long)this_00->begin;
      memcpy(local_b8,this_00->begin,(ulong)*puVar7 + lVar8 + 2);
      pcVar9 = local_b8 + lVar8;
    }
    (this->buffer_).v2_.last = pcVar9;
  }
  commit_new_buffer(this,&local_b8,&local_b0);
  (this->buffer_).v2_.end = (this->buffer_).v2_.begin + size;
LAB_0010dd62:
  buffer_t<char>::validate(this_00);
  validate_data_invariants(this);
  if (local_b8 != (char *)0x0) {
    deallocate_buffer(this,local_b8,local_b0);
  }
  return;
}

Assistant:

void resize_buffer(size_type size) {
        validate_pointer_invariants();

        sizes_t const prev_sizes{ get_all_sizes() };

        char *new_buffer{ nullptr };
        size_t new_buffer_size{ 0 };
        auto deallocate_buffer{ make_scoped_deallocator(&new_buffer, &new_buffer_size) };
        //
        // growing capacity
        //
        if (prev_sizes.total_capacity < size) {
            new_buffer = allocate_buffer(size);
            new_buffer_size = size;
            if (nullptr != buff().last) {
                copy_data(new_buffer, buff().begin, prev_sizes.used_capacity().size);
                buff().last = new_buffer + prev_sizes.last_element.begin();
            }
            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        //
        // shrinking to 0 is simple
        //
        } else if (0 == size) {
            clear();
        //
        // to shrink to a smaller size we first need to 
        // find last element that would completely fit 
        // in the new buffer, and if we found any, then
        // make it new last element. If we did not find 
        // any, then designate that there are no last 
        // element
        //
        } else if (prev_sizes.total_capacity > size) {

            new_buffer = allocate_buffer(size);
            new_buffer_size = size;

            bool is_valid{ true };
            char *last_valid{ buff().last };
            //
            // If we are shrinking below used capacity then last element will
            // be removed, and we need to do linear search for the new last element 
            // that would fit new buffer size.
            //
            if (prev_sizes.used_capacity().size > size) {
                flat_forward_list_ref<T, TT> buffer_view;
                std::tie(is_valid, buffer_view) = flat_forward_list_validate<T, TT>(buff().begin,
                                                                                    buff().begin + size);
                if (is_valid) {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() == buff().last);
                } else {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() != buff().last);
                }
                last_valid = buffer_view.last().get_ptr();
            }

            if (last_valid) {
                size_type new_last_element_offset = last_valid - buff().begin;

                size_with_padding_t const last_valid_element_size{ traits_traits::get_size(last_valid) };
                size_type const new_used_capacity{ new_last_element_offset + last_valid_element_size.size };
                
                set_no_next_element(last_valid);
                
                copy_data(new_buffer, buff().begin, new_used_capacity);
                buff().last = new_buffer + new_last_element_offset;
            } else {
                buff().last = nullptr;
            }

            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        }

        validate_pointer_invariants();
        validate_data_invariants();
    }